

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  string *default_value;
  long *plVar1;
  uint32 uVar2;
  CppType CVar3;
  FieldDescriptor *this_00;
  ulong uVar4;
  uint32 *puVar5;
  undefined8 *puVar6;
  ArenaStringPtr *this_01;
  Arena *arena;
  
  if ((*(int *)(oneof_descriptor + 0x18) == 1) &&
     (((FieldDescriptor *)**(undefined8 **)(oneof_descriptor + 0x20))[0x41] == (FieldDescriptor)0x1)
     ) {
    ClearField(this,message,(FieldDescriptor *)**(undefined8 **)(oneof_descriptor + 0x20));
    return;
  }
  uVar2 = GetOneofCase(this,message,oneof_descriptor);
  if (uVar2 != 0) {
    this_00 = Descriptor::FindFieldByNumber(this->descriptor_,uVar2);
    uVar4 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar4 & 1) != 0) {
      uVar4 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
    }
    if (uVar4 == 0) {
      CVar3 = FieldDescriptor::cpp_type(this_00);
      if (CVar3 == CPPTYPE_MESSAGE) {
        uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
        plVar1 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
      }
      else if (CVar3 == CPPTYPE_STRING) {
        puVar6 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,this_00);
        default_value = (string *)*puVar6;
        this_01 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,this_00);
        arena = *(Arena **)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uint)(this->schema_).metadata_offset_);
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Destroy(this_01,default_value,arena);
      }
    }
    puVar5 = MutableOneofCase(this,message,oneof_descriptor);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    ClearField(message, oneof_descriptor->field(0));
    return;
  }
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)
                  ->Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}